

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequenceedit.cpp
# Opt level: O0

void __thiscall QKeySequenceEdit::setMaximumSequenceLength(QKeySequenceEdit *this,qsizetype count)

{
  QKeyCombination QVar1;
  QKeySequenceEditPrivate *file;
  QKeySequenceEditPrivate *this_00;
  QMessageLogger *in_RSI;
  long in_FS_OFFSET;
  qsizetype i;
  QKeySequenceEditPrivate *d;
  int in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined8 in_stack_ffffffffffffffb0;
  int line;
  char local_28 [32];
  long local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  file = d_func((QKeySequenceEdit *)0x5a71ca);
  if (((long)in_RSI < 1) || (4 < (long)in_RSI)) {
    QMessageLogger::QMessageLogger
              (in_RSI,(char *)file,line,
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    QMessageLogger::warning
              (local_28,"QKeySequenceEdit: maximumSequenceLength %lld is out of range (1..%d)",
               in_RSI,4);
  }
  else {
    file->maximumSequenceLength = (int)in_RSI;
    if ((long)in_RSI < (long)file->keyNum) {
      for (this_00 = (QKeySequenceEditPrivate *)(long)file->keyNum; (long)this_00 < (long)in_RSI;
          this_00 = (QKeySequenceEditPrivate *)&(this_00->super_QWidgetPrivate).field_0x1) {
        QVar1 = QKeyCombination::fromCombined(in_stack_ffffffffffffffa8);
        file->key[(long)this_00].combination = QVar1.combination;
      }
      file->keyNum = (int)in_RSI;
      QKeySequenceEditPrivate::rebuildKeySequence(this_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QKeySequenceEdit::setMaximumSequenceLength(qsizetype count)
{
    Q_D(QKeySequenceEdit);

    if (count < 1 || count > QKeySequencePrivate::MaxKeyCount) {
        qWarning("QKeySequenceEdit: maximumSequenceLength %lld is out of range (1..%d)",
                 qlonglong(count), QKeySequencePrivate::MaxKeyCount);
        return;
    }
    d->maximumSequenceLength = int(count);
    if (d->keyNum > count) {
        for (qsizetype i = d->keyNum; i < count; ++i)
            d->key[i] = QKeyCombination::fromCombined(0);
        d->keyNum = count;
        d->rebuildKeySequence();
    }
}